

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O3

int lws_dynamic_token_insert(lws *wsi,int hdr_len,int lws_hdr_index,char *arg,size_t len)

{
  hpack_dynamic_table *dyn;
  undefined8 *puVar1;
  ushort uVar2;
  ushort uVar3;
  uint32_t uVar4;
  lws_h2_netconn *plVar5;
  lws *plVar6;
  void *pvVar7;
  hpack_dt_entry *phVar8;
  char *pcVar9;
  ulong uVar10;
  uint16_t uVar11;
  int iVar12;
  undefined4 in_register_00000034;
  char *pcVar13;
  uint idx;
  uint32_t uVar14;
  
  plVar6 = lws_get_network_wsi(wsi);
  plVar5 = (plVar6->h2).h2n;
  iVar12 = 1;
  if (plVar5 != (lws_h2_netconn *)0x0) {
    if ((plVar5->hpack_dyn_table).entries == (hpack_dt_entry *)0x0) {
      _lws_log(1,"%s: unsized dyn table\n","lws_dynamic_token_insert");
    }
    else {
      dyn = &plVar5->hpack_dyn_table;
      uVar2 = (plVar5->hpack_dyn_table).num_entries;
      idx = 0;
      if ((uVar2 != 0) &&
         (idx = (uint)(plVar5->hpack_dyn_table).pos % (uint)uVar2,
         (plVar5->hpack_dyn_table).used_entries == uVar2)) {
        if ((plVar5->hpack_dyn_table).virtual_payload_usage <
            (plVar5->hpack_dyn_table).virtual_payload_max) {
          _lws_log(1,"Dropping header content before limit!\n");
        }
        lws_dynamic_free(dyn,idx);
      }
      uVar4 = (plVar5->hpack_dyn_table).virtual_payload_usage;
      while (((uVar14 = 0, uVar4 != 0 &&
              (uVar2 = (plVar5->hpack_dyn_table).used_entries, uVar14 = uVar4, uVar2 != 0)) &&
             ((ulong)((plVar5->hpack_dyn_table).virtual_payload_max + 0x400) <
              (hdr_len + uVar4) + len))) {
        uVar3 = (plVar5->hpack_dyn_table).num_entries;
        iVar12 = 0;
        if (uVar3 != 0) {
          iVar12 = (int)((uint)(plVar5->hpack_dyn_table).pos - (uint)uVar2) % (int)(uint)uVar3;
          iVar12 = (iVar12 >> 0x1f & (uint)uVar3) + iVar12;
        }
        lws_dynamic_free(dyn,iVar12);
        uVar4 = (plVar5->hpack_dyn_table).virtual_payload_usage;
      }
      uVar2 = (plVar5->hpack_dyn_table).used_entries;
      if (uVar2 < (plVar5->hpack_dyn_table).num_entries) {
        (plVar5->hpack_dyn_table).used_entries = uVar2 + 1;
      }
      phVar8 = dyn->entries;
      puVar1 = (undefined8 *)((long)&phVar8->value + (ulong)(idx << 4));
      *(undefined2 *)((long)&phVar8->value_len + (ulong)(idx << 4)) = 0;
      if (lws_hdr_index == 0xffff) {
        *puVar1 = 0;
        pcVar9 = (char *)0x0;
      }
      else {
        pvVar7 = (void *)*puVar1;
        if (pvVar7 != (void *)0x0) {
          lws_realloc(pvVar7,0,"free");
          *(undefined8 *)((long)&dyn->entries->value + (ulong)(idx << 4)) = 0;
        }
        pvVar7 = lws_realloc((void *)0x0,len + 1,"hpack dyn");
        *(void **)((long)&dyn->entries->value + (ulong)(idx << 4)) = pvVar7;
        if (pvVar7 == (void *)0x0) {
          return 1;
        }
        memcpy(pvVar7,arg,len);
        uVar10 = (ulong)(idx << 4);
        *(undefined1 *)(*(long *)((long)&((plVar5->hpack_dyn_table).entries)->value + uVar10) + len)
             = 0;
        phVar8 = (plVar5->hpack_dyn_table).entries;
        *(short *)((long)&phVar8->value_len + uVar10) = (short)len;
        uVar14 = (plVar5->hpack_dyn_table).virtual_payload_usage;
        pcVar9 = *(char **)((long)&phVar8->value + uVar10);
      }
      *(short *)((long)&phVar8->lws_hdr_idx + (ulong)(idx << 4)) = (short)lws_hdr_index;
      *(short *)((long)&phVar8->hdr_len + (ulong)(idx << 4)) = (short)hdr_len;
      (plVar5->hpack_dyn_table).virtual_payload_usage = uVar14 + (int)len + hdr_len;
      pcVar13 = "null";
      if (pcVar9 != (char *)0x0) {
        pcVar13 = pcVar9;
      }
      iVar12 = 0;
      _lws_log(8,"%s: index %ld: lws_hdr_index 0x%x, hdr len %d, \'%s\' len %d\n",
               "lws_dynamic_token_insert",0x3e,(ulong)(uint)lws_hdr_index,
               CONCAT44(in_register_00000034,hdr_len),pcVar13,len);
      uVar2 = (plVar5->hpack_dyn_table).num_entries;
      if (uVar2 == 0) {
        uVar11 = 0;
      }
      else {
        uVar11 = (uint16_t)(((plVar5->hpack_dyn_table).pos + 1) % (uint)uVar2);
      }
      (plVar5->hpack_dyn_table).pos = uVar11;
    }
  }
  return iVar12;
}

Assistant:

static int
lws_dynamic_token_insert(struct lws *wsi, int hdr_len,
			 int lws_hdr_index, char *arg, size_t len)
{
	struct hpack_dynamic_table *dyn;
	int new_index;

	/* dynamic table only belongs to network wsi */
	wsi = lws_get_network_wsi(wsi);
	if (!wsi->h2.h2n)
		return 1;
	dyn = &wsi->h2.h2n->hpack_dyn_table;

	if (!dyn->entries) {
		lwsl_err("%s: unsized dyn table\n", __func__);

		return 1;
	}
	lws_h2_dynamic_table_dump(wsi);

	new_index = lws_safe_modulo(dyn->pos, dyn->num_entries);
	if (dyn->num_entries && dyn->used_entries == dyn->num_entries) {
		if (dyn->virtual_payload_usage < dyn->virtual_payload_max)
			lwsl_err("Dropping header content before limit!\n");
		/* we have to drop the oldest to make space */
		lws_dynamic_free(dyn, new_index);
	}

	/*
	 * evict guys to make room, allowing for some overage.  We have to
	 * take care about getting a single huge header, and evicting
	 * everything
	 */

	while (dyn->virtual_payload_usage &&
	       dyn->used_entries &&
	       dyn->virtual_payload_usage + (unsigned int)hdr_len + len >
				dyn->virtual_payload_max + 1024) {
		int n = lws_safe_modulo(dyn->pos - dyn->used_entries,
						dyn->num_entries);
		if (n < 0)
			n += dyn->num_entries;
		lws_dynamic_free(dyn, n);
	}

	if (dyn->used_entries < dyn->num_entries)
		dyn->used_entries++;

	dyn->entries[new_index].value_len = 0;

	if (lws_hdr_index != LWS_HPACK_IGNORE_ENTRY) {
		if (dyn->entries[new_index].value)
			lws_free_set_NULL(dyn->entries[new_index].value);
		dyn->entries[new_index].value =
				lws_malloc(len + 1, "hpack dyn");
		if (!dyn->entries[new_index].value)
			return 1;

		memcpy(dyn->entries[new_index].value, arg, len);
		dyn->entries[new_index].value[len] = '\0';
		dyn->entries[new_index].value_len = (uint16_t)len;
	} else
		dyn->entries[new_index].value = NULL;

	dyn->entries[new_index].lws_hdr_idx = (uint16_t)lws_hdr_index;
	dyn->entries[new_index].hdr_len = (uint16_t)hdr_len;

	dyn->virtual_payload_usage = (uint32_t)(dyn->virtual_payload_usage +
					(unsigned int)hdr_len + len);

	lwsl_info("%s: index %ld: lws_hdr_index 0x%x, hdr len %d, '%s' len %d\n",
		  __func__, (long)LWS_ARRAY_SIZE(static_token),
		  lws_hdr_index, hdr_len, dyn->entries[new_index].value ?
				 dyn->entries[new_index].value : "null", (int)len);

	dyn->pos = (uint16_t)lws_safe_modulo(dyn->pos + 1, dyn->num_entries);

	lws_h2_dynamic_table_dump(wsi);

	return 0;
}